

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder_mf.c
# Opt level: O1

lzma_match *
bt_find_func(uint32_t len_limit,uint32_t pos,uint8_t *cur,uint32_t cur_match,uint32_t depth,
            uint32_t *son,uint32_t cyclic_pos,uint32_t cyclic_size,lzma_match *matches,
            uint32_t len_best)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  uint32_t *puVar5;
  uint32_t uVar6;
  uint uVar7;
  uint32_t *puVar8;
  uint uVar9;
  uint uVar10;
  uint32_t *puVar11;
  bool bVar12;
  uint32_t local_60;
  uint local_5c;
  uint32_t *local_58;
  lzma_match *local_40;
  
  local_60 = len_best;
  local_58 = son + cyclic_pos * 2;
  puVar5 = son + (ulong)(cyclic_pos * 2) + 1;
  local_5c = 0;
  uVar10 = 0;
  do {
    bVar12 = depth == 0;
    depth = depth - 1;
    if ((bVar12) || (uVar7 = pos - cur_match, cyclic_size <= uVar7)) {
      bVar12 = false;
      *puVar5 = 0;
      *local_58 = 0;
      local_40 = matches;
    }
    else {
      uVar6 = 0;
      if (cyclic_pos < uVar7) {
        uVar6 = cyclic_size;
      }
      uVar9 = uVar10;
      if (local_5c < uVar10) {
        uVar9 = local_5c;
      }
      uVar3 = (ulong)uVar9;
      puVar11 = son + ((cyclic_pos - uVar7) + uVar6) * 2;
      if (cur[uVar3 - uVar7] == cur[uVar3]) {
        uVar9 = uVar9 + 1;
        if (len_limit < uVar9) {
          __assert_fail("len <= limit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmliblzma/liblzma/common/memcmplen.h"
                        ,0x2e,
                        "uint32_t lzma_memcmplen(const uint8_t *, const uint8_t *, uint32_t, uint32_t)"
                       );
        }
        puVar8 = son;
        if ((int)len_limit < 0) {
          __assert_fail("limit <= UINT32_MAX / 2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmliblzma/liblzma/common/memcmplen.h"
                        ,0x2f,
                        "uint32_t lzma_memcmplen(const uint8_t *, const uint8_t *, uint32_t, uint32_t)"
                       );
        }
        do {
          uVar6 = len_limit;
          if (len_limit <= uVar9) break;
          uVar3 = (ulong)uVar9;
          uVar4 = *(long *)(cur + (uVar3 - uVar7)) - *(long *)(cur + uVar3);
          if (uVar4 == 0) {
            uVar9 = uVar9 + 8;
          }
          else {
            uVar1 = 0;
            if (uVar4 != 0) {
              for (; (uVar4 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
              }
            }
            uVar9 = ((uint)(uVar1 >> 3) & 0x1fffffff) + uVar9;
            uVar2 = len_limit;
            if (uVar9 < len_limit) {
              uVar2 = uVar9;
            }
            puVar8 = (uint32_t *)(ulong)uVar2;
          }
          uVar6 = (uint32_t)puVar8;
        } while (*(long *)(cur + (uVar3 - uVar7)) == *(long *)(cur + uVar3));
        if (local_60 < uVar6) {
          matches->len = uVar6;
          matches->dist = uVar7 - 1;
          matches = matches + 1;
          local_60 = uVar6;
          if (uVar6 == len_limit) {
            *local_58 = *puVar11;
            *puVar5 = puVar11[1];
            bVar12 = false;
            local_40 = matches;
            goto LAB_004b3256;
          }
        }
        uVar3 = (ulong)uVar6;
      }
      if (cur[uVar3 - uVar7] < cur[uVar3]) {
        *local_58 = cur_match;
        puVar11 = puVar11 + 1;
        uVar10 = (uint)uVar3;
        local_58 = puVar11;
      }
      else {
        *puVar5 = cur_match;
        puVar5 = puVar11;
        local_5c = (uint)uVar3;
      }
      cur_match = *puVar11;
      bVar12 = true;
    }
LAB_004b3256:
    if (!bVar12) {
      return local_40;
    }
  } while( true );
}

Assistant:

static lzma_match *
bt_find_func(
		const uint32_t len_limit,
		const uint32_t pos,
		const uint8_t *const cur,
		uint32_t cur_match,
		uint32_t depth,
		uint32_t *const son,
		const uint32_t cyclic_pos,
		const uint32_t cyclic_size,
		lzma_match *matches,
		uint32_t len_best)
{
	uint32_t *ptr0 = son + (cyclic_pos << 1) + 1;
	uint32_t *ptr1 = son + (cyclic_pos << 1);

	uint32_t len0 = 0;
	uint32_t len1 = 0;

	while (true) {
		const uint32_t delta = pos - cur_match;
		if (depth-- == 0 || delta >= cyclic_size) {
			*ptr0 = EMPTY_HASH_VALUE;
			*ptr1 = EMPTY_HASH_VALUE;
			return matches;
		}

		uint32_t *const pair = son + ((cyclic_pos - delta
				+ (delta > cyclic_pos ? cyclic_size : 0))
				<< 1);

		const uint8_t *const pb = cur - delta;
		uint32_t len = my_min(len0, len1);

		if (pb[len] == cur[len]) {
			len = lzma_memcmplen(pb, cur, len + 1, len_limit);

			if (len_best < len) {
				len_best = len;
				matches->len = len;
				matches->dist = delta - 1;
				++matches;

				if (len == len_limit) {
					*ptr1 = pair[0];
					*ptr0 = pair[1];
					return matches;
				}
			}
		}

		if (pb[len] < cur[len]) {
			*ptr1 = cur_match;
			ptr1 = pair + 1;
			cur_match = *ptr1;
			len1 = len;
		} else {
			*ptr0 = cur_match;
			ptr0 = pair;
			cur_match = *ptr0;
			len0 = len;
		}
	}
}